

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentationFormatter.cxx
# Opt level: O3

void __thiscall
cmDocumentationFormatter::PrintColumn(cmDocumentationFormatter *this,ostream *os,char *text)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  byte bVar8;
  long lVar9;
  bool bVar10;
  
  bVar8 = *text;
  if (bVar8 != 0) {
    iVar1 = this->TextWidth;
    sVar2 = strlen(this->TextIndent);
    bVar4 = true;
    bVar10 = false;
    lVar5 = 0;
    do {
      lVar9 = 0;
      while ((0x20 < bVar8 || ((0x100000401U >> ((ulong)bVar8 & 0x3f) & 1) == 0))) {
        bVar8 = text[lVar9 + 1];
        lVar9 = lVar9 + 1;
      }
      pcVar7 = text + lVar9;
      if (lVar9 < (long)(((long)iVar1 - (long)(int)sVar2) - ((ulong)bVar10 + lVar5))) {
        if (text < pcVar7) {
          if (lVar5 == 0) {
            pcVar6 = "";
            if (!bVar4) {
              pcVar6 = this->TextIndent;
            }
            if (pcVar6 == (char *)0x0) {
              std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
            }
            else {
              sVar3 = strlen(pcVar6);
              std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar3);
            }
            lVar5 = 0;
          }
          else if (bVar10 == false) {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            lVar5 = lVar5 + 1;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
            lVar5 = lVar5 + 2;
          }
          std::ostream::write((char *)os,(long)text);
          bVar8 = text[lVar9];
          bVar10 = text[lVar9 + -1] == '.';
        }
        if (bVar8 == 10) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          pcVar7 = text + lVar9 + 1;
LAB_001734e8:
          lVar5 = 0;
          goto LAB_001734eb;
        }
        lVar5 = lVar9 + lVar5;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (pcVar7 <= text) goto LAB_001734e8;
        pcVar6 = this->TextIndent;
        if (pcVar6 == (char *)0x0) {
          std::ios::clear((int)os + (int)os->_vptr_basic_ostream[-3]);
        }
        else {
          sVar3 = strlen(pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar6,sVar3);
        }
        std::ostream::write((char *)os,(long)text);
        bVar10 = text[lVar9 + -1] == '.';
        lVar5 = lVar9;
LAB_001734eb:
        bVar4 = false;
      }
      text = pcVar7 + -1;
      do {
        bVar8 = text[1];
        text = text + 1;
      } while (bVar8 == 0x20);
    } while (bVar8 != 0);
  }
  return;
}

Assistant:

void cmDocumentationFormatter::PrintColumn(std::ostream& os, const char* text)
{
  // Print text arranged in an indented column of fixed width.
  const char* l = text;
  long column = 0;
  bool newSentence = false;
  bool firstLine = true;
  int width = this->TextWidth - static_cast<int>(strlen(this->TextIndent));

  // Loop until the end of the text.
  while (*l) {
    // Parse the next word.
    const char* r = l;
    while (*r && (*r != '\n') && (*r != ' ')) {
      ++r;
    }

    // Does it fit on this line?
    if (r - l < (width - column - (newSentence ? 1 : 0))) {
      // Word fits on this line.
      if (r > l) {
        if (column) {
          // Not first word on line.  Separate from the previous word
          // by a space, or two if this is a new sentence.
          if (newSentence) {
            os << "  ";
            column += 2;
          } else {
            os << " ";
            column += 1;
          }
        } else {
          // First word on line.  Print indentation unless this is the
          // first line.
          os << (firstLine ? "" : this->TextIndent);
        }

        // Print the word.
        os.write(l, static_cast<long>(r - l));
        newSentence = (*(r - 1) == '.');
      }

      if (*r == '\n') {
        // Text provided a newline.  Start a new line.
        os << "\n";
        ++r;
        column = 0;
        firstLine = false;
      } else {
        // No provided newline.  Continue this line.
        column += static_cast<long>(r - l);
      }
    } else {
      // Word does not fit on this line.  Start a new line.
      os << "\n";
      firstLine = false;
      if (r > l) {
        os << this->TextIndent;
        os.write(l, static_cast<long>(r - l));
        column = static_cast<long>(r - l);
        newSentence = (*(r - 1) == '.');
      } else {
        column = 0;
      }
    }

    // Move to beginning of next word.  Skip over whitespace.
    l = r;
    while (*l == ' ') {
      ++l;
    }
  }
}